

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxShape.h
# Opt level: O2

cbtVector3 __thiscall cbtBoxShape::localGetSupportingVertex(cbtBoxShape *this,cbtVector3 *vec)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar8;
  undefined1 auVar7 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  cbtVector3 cVar12;
  float local_28;
  float fStack_24;
  
  fVar8 = (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
          m_implicitShapeDimensions.m_floats[0];
  uVar1 = *(ulong *)((this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
                     m_implicitShapeDimensions.m_floats + 1);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar1;
  (*(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])();
  fVar6 = auVar7._0_4_;
  (*(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(this);
  auVar4 = auVar7;
  (*(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(this);
  uVar2 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)vec->m_floats[0]),2);
  bVar3 = (bool)((byte)uVar2 & 1);
  fVar6 = fVar6 + fVar8;
  auVar4 = vinsertps_avx(auVar7,auVar4,0x10);
  local_28 = (float)uVar1;
  fStack_24 = (float)(uVar1 >> 0x20);
  local_28 = auVar4._0_4_ + local_28;
  fStack_24 = auVar4._4_4_ + fStack_24;
  fVar8 = auVar4._8_4_ + 0.0;
  fVar9 = auVar4._12_4_ + 0.0;
  auVar11._0_4_ = -fVar6;
  auVar11._4_4_ = 0x80000000;
  auVar11._8_4_ = 0x80000000;
  auVar11._12_4_ = 0x80000000;
  auVar4._4_12_ = auVar11._4_12_;
  auVar4._0_4_ = (uint)bVar3 * (int)fVar6 + (uint)!bVar3 * (int)auVar11._0_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(vec->m_floats + 1);
  uVar1 = vcmpps_avx512vl(ZEXT416(0) << 0x40,auVar10,2);
  bVar3 = (bool)((byte)uVar1 & 1);
  auVar5._0_4_ = (uint)bVar3 * (int)local_28 | (uint)!bVar3 * (int)-local_28;
  bVar3 = (bool)((byte)(uVar1 >> 1) & 1);
  auVar5._4_4_ = (uint)bVar3 * (int)fStack_24 | (uint)!bVar3 * (int)-fStack_24;
  bVar3 = (bool)((byte)(uVar1 >> 2) & 1);
  auVar5._8_4_ = (uint)bVar3 * (int)fVar8 | (uint)!bVar3 * (int)-fVar8;
  bVar3 = (bool)((byte)(uVar1 >> 3) & 1);
  auVar5._12_4_ = (uint)bVar3 * (int)fVar9 | (uint)!bVar3 * (int)-fVar9;
  auVar4 = vinsertps_avx(auVar4,auVar5,0x1c);
  auVar5 = vinsertps_avx(auVar4,auVar5,0x4e);
  cVar12.m_floats._0_8_ = auVar4._0_8_;
  cVar12.m_floats._8_8_ = auVar5._0_8_;
  return (cbtVector3)cVar12.m_floats;
}

Assistant:

virtual cbtVector3 localGetSupportingVertex(const cbtVector3& vec) const
	{
		cbtVector3 halfExtents = getHalfExtentsWithoutMargin();
		cbtVector3 margin(getMargin(), getMargin(), getMargin());
		halfExtents += margin;

		return cbtVector3(cbtFsels(vec.x(), halfExtents.x(), -halfExtents.x()),
						 cbtFsels(vec.y(), halfExtents.y(), -halfExtents.y()),
						 cbtFsels(vec.z(), halfExtents.z(), -halfExtents.z()));
	}